

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O0

void __thiscall helics::tcp::TcpComms::queue_rx_function(TcpComms *this)

{
  string_view message_00;
  string_view message_01;
  milliseconds timeOut;
  bool bVar1;
  undefined1 uVar2;
  __int_type _Var3;
  SocketFactory *sf_00;
  CommsInterface *pCVar4;
  element_type *peVar5;
  io_context *io_context;
  int iVar6;
  undefined1 *puVar7;
  int *__rep;
  char *in_RDI;
  ActionMessage message_1;
  bool loopRunning;
  CommsInterface *ci;
  LoopHandle contextLoop;
  bool connected;
  pointer server;
  SocketFactory sf;
  shared_ptr<gmlc::networking::AsioContextManager> ioctx;
  ActionMessage message;
  memory_order __b;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffcbc;
  TcpServer *in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  ConnectionStatus in_stack_fffffffffffffccc;
  CommsInterface *in_stack_fffffffffffffcd0;
  ActionMessage *in_stack_fffffffffffffce8;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  io_context *in_stack_fffffffffffffd00;
  undefined7 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd0f;
  undefined8 in_stack_fffffffffffffd10;
  string *in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  undefined4 in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd3c;
  undefined4 in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  duration<long,std::ratio<1l,1000l>> local_2b0 [12];
  ConnectionStatus local_2a4;
  TcpServer *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  byte bVar9;
  AsioContextManager *in_stack_fffffffffffffe48;
  BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
  *in_stack_fffffffffffffe78;
  int local_16c;
  duration<long,std::ratio<1l,1000l>> local_168 [24];
  undefined1 local_150 [32];
  undefined1 local_130 [24];
  undefined4 local_e8;
  int local_d4;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  _Alloc_hider local_8;
  
  while( true ) {
    _Var3 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)
                       CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    uVar2 = (undefined1)((ulong)in_stack_fffffffffffffd10 >> 0x38);
    if (-1 < _Var3) break;
    gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::pop
              (in_stack_fffffffffffffe78);
    bVar1 = isProtocolCommand((ActionMessage *)in_stack_fffffffffffffcc0);
    if (bVar1) {
      in_stack_fffffffffffffd3c = local_d4;
      if (local_d4 == 0x5ab) {
        NetworkCommsInterface::loadPortDefinitions
                  ((NetworkCommsInterface *)
                   CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                   in_stack_fffffffffffffce8);
        goto LAB_004a4bf0;
      }
      if ((local_d4 != 0x9db) && (local_d4 != 0x16570bf)) goto LAB_004a4bf0;
      std::atomic<bool>::operator=
                ((atomic<bool> *)in_stack_fffffffffffffcc0,
                 SUB41((uint)in_stack_fffffffffffffcbc >> 0x18,0));
      CommsInterface::setRxStatus(in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc);
      local_e8 = 1;
    }
    else {
LAB_004a4bf0:
      local_e8 = 0;
    }
    ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffcc0);
    if (local_e8 != 0) {
      return;
    }
  }
  _Var3 = std::__atomic_base::operator_cast_to_int
                    ((__atomic_base<int> *)
                     CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  if (_Var3 < 0) {
    CommsInterface::setRxStatus(in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc);
    return;
  }
  pCVar4 = (CommsInterface *)&stack0xfffffffffffffee8;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcd0);
  gmlc::networking::AsioContextManager::getContextPointer
            ((string *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcc0);
  if ((in_RDI[0x41c] & 1U) == 0) {
    memset(local_130,0,0x18);
    gmlc::networking::SocketFactory::SocketFactory((SocketFactory *)in_stack_fffffffffffffcc0);
  }
  else {
    gmlc::networking::SocketFactory::SocketFactory
              ((SocketFactory *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
               in_stack_fffffffffffffd18,(bool)uVar2);
  }
  std::
  __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x4a4ce6);
  gmlc::networking::AsioContextManager::getBaseContext((AsioContextManager *)0x4a4cee);
  io_context = (io_context *)(in_RDI + 0xf0);
  sf_00 = (SocketFactory *)(in_RDI + 0x414);
  local_c = 5;
  local_8._M_p = (pointer)sf_00;
  local_10 = CLI::std::operator&(seq_cst,__memory_order_mask);
  if (local_c - 1 < 2) {
    local_14 = *(undefined4 *)
                &(sf_00->super_enable_shared_from_this<gmlc::networking::SocketFactory>).
                 _M_weak_this.
                 super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
  }
  else if (local_c == 5) {
    local_14 = *(undefined4 *)
                &(sf_00->super_enable_shared_from_this<gmlc::networking::SocketFactory>).
                 _M_weak_this.
                 super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
  }
  else {
    local_14 = *(undefined4 *)
                &(sf_00->super_enable_shared_from_this<gmlc::networking::SocketFactory>).
                 _M_weak_this.
                 super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
  }
  uVar8 = *(undefined4 *)(in_RDI + 0x268);
  puVar7 = local_130;
  gmlc::networking::TcpServer::create
            (sf_00,io_context,
             (string *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             (uint16_t)((ulong)in_stack_fffffffffffffd00 >> 0x30),
             SUB81((ulong)in_stack_fffffffffffffd00 >> 0x28,0),(int)pCVar4);
  do {
    while( true ) {
      iVar6 = (int)puVar7;
      std::
      __shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4a4def);
      uVar2 = gmlc::networking::TcpServer::isReady((TcpServer *)0x4a4df7);
      if (((uVar2 ^ 0xff) & 1) == 0) {
        std::
        __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x4a50ba);
        gmlc::networking::AsioContextManager::startContextLoop(in_stack_fffffffffffffe48);
        std::
        __shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x4a50d9);
        std::
        function<unsigned_long(std::shared_ptr<gmlc::networking::TcpConnection>,char_const*,unsigned_long)>
        ::function<helics::tcp::TcpComms::queue_rx_function()::__0,void>
                  ((function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                    *)in_stack_fffffffffffffcd0,
                   (anon_class_8_1_8991fb9c *)
                   CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        gmlc::networking::TcpServer::setDataCall
                  (in_stack_fffffffffffffcc0,
                   (function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                    *)CONCAT44(in_stack_fffffffffffffcbc,uVar8));
        std::
        function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
        ::~function((function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                     *)0x4a5129);
        pCVar4 = (CommsInterface *)
                 std::
                 __shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4a5146);
        std::function<bool(std::shared_ptr<gmlc::networking::TcpConnection>,std::error_code_const&)>
        ::function<helics::tcp::TcpComms::queue_rx_function()::__1,void>
                  ((function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                    *)pCVar4,
                   (anon_class_8_1_3fcf6524 *)
                   CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        gmlc::networking::TcpServer::setErrorCall
                  (in_stack_fffffffffffffcc0,
                   (function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                    *)CONCAT44(in_stack_fffffffffffffcbc,uVar8));
        std::
        function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>::
        ~function((function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                   *)0x4a5193);
        std::
        __shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x4a51a0);
        gmlc::networking::TcpServer::start(in_stack_fffffffffffffe08);
        CommsInterface::setRxStatus(pCVar4,in_stack_fffffffffffffccc);
        bVar9 = 1;
        while ((bVar9 & 1) != 0) {
          gmlc::containers::
          BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::pop
                    (in_stack_fffffffffffffe78);
          bVar1 = isProtocolCommand((ActionMessage *)in_stack_fffffffffffffcc0);
          if ((bVar1) &&
             ((in_stack_fffffffffffffccc = local_2a4, local_2a4 == 0x9db || (local_2a4 == 0x16570bf)
              ))) {
            bVar9 = 0;
          }
          ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffcc0);
        }
        std::atomic<bool>::operator=
                  ((atomic<bool> *)in_stack_fffffffffffffcc0,
                   SUB41((uint)in_stack_fffffffffffffcbc >> 0x18,0));
        __rep = (int *)&stack0xfffffffffffffd4c;
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_2b0,__rep);
        iVar6 = (int)__rep;
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                  ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffd00);
        peVar5 = std::
                 __shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4a52fe);
        gmlc::networking::TcpServer::close(peVar5,iVar6);
        CommsInterface::setRxStatus(pCVar4,in_stack_fffffffffffffccc);
        std::
        unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
        ::~unique_ptr((unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                       *)pCVar4);
        local_e8 = 0;
        goto LAB_004a5334;
      }
      if (((in_RDI[0x418] & 1U) == 0) ||
         (bVar1 = std::atomic::operator_cast_to_bool
                            ((atomic<bool> *)
                             CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)), !bVar1)
         ) break;
      peVar5 = std::
               __shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4a4e4b);
      gmlc::networking::TcpServer::close(peVar5,iVar6);
      std::__atomic_base<int>::operator++((__atomic_base<int> *)(in_RDI + 0x414));
      std::
      __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x4a4e76);
      in_stack_fffffffffffffd00 =
           gmlc::networking::AsioContextManager::getBaseContext((AsioContextManager *)0x4a4e7e);
      std::__atomic_base::operator_cast_to_int
                ((__atomic_base<int> *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)
                );
      uVar8 = *(undefined4 *)(in_RDI + 0x268);
      gmlc::networking::TcpServer::create
                (sf_00,io_context,(string *)CONCAT17(uVar2,in_stack_fffffffffffffd08),
                 (uint16_t)((ulong)in_stack_fffffffffffffd00 >> 0x30),
                 SUB81((ulong)in_stack_fffffffffffffd00 >> 0x28,0),(int)pCVar4);
      puVar7 = local_150;
      std::shared_ptr<gmlc::networking::TcpServer>::operator=
                ((shared_ptr<gmlc::networking::TcpServer> *)in_stack_fffffffffffffcc0,
                 (shared_ptr<gmlc::networking::TcpServer> *)
                 CONCAT44(in_stack_fffffffffffffcbc,uVar8));
      std::shared_ptr<gmlc::networking::TcpServer>::~shared_ptr
                ((shared_ptr<gmlc::networking::TcpServer> *)0x4a4f0d);
    }
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffcd0,
               (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    message_00._M_len._4_4_ = in_stack_fffffffffffffd3c;
    message_00._M_len._0_4_ = in_stack_fffffffffffffd38;
    message_00._M_str = in_RDI;
    CommsInterface::logWarning(pCVar4,message_00);
    local_16c = 0x96;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_168,&local_16c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffd00);
    std::__shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4a4ff4);
    puVar7 = *(undefined1 **)(in_RDI + 0x260);
    timeOut.__r._7_1_ = in_stack_fffffffffffffe17;
    timeOut.__r._0_7_ = in_stack_fffffffffffffe10;
    bVar1 = gmlc::networking::TcpServer::reConnect(in_stack_fffffffffffffe08,timeOut);
  } while (bVar1);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffcd0,
             (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  iVar6 = (int)in_stack_fffffffffffffe78;
  message_01._M_len._4_4_ = in_stack_fffffffffffffd3c;
  message_01._M_len._0_4_ = in_stack_fffffffffffffd38;
  message_01._M_str = in_RDI;
  CommsInterface::logError(pCVar4,message_01);
  peVar5 = std::
           __shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4a5078);
  gmlc::networking::TcpServer::close(peVar5,iVar6);
  CommsInterface::setRxStatus(in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc);
  local_e8 = 1;
LAB_004a5334:
  std::shared_ptr<gmlc::networking::TcpServer>::~shared_ptr
            ((shared_ptr<gmlc::networking::TcpServer> *)0x4a5341);
  gmlc::networking::SocketFactory::~SocketFactory((SocketFactory *)0x4a534e);
  std::shared_ptr<gmlc::networking::AsioContextManager>::~shared_ptr
            ((shared_ptr<gmlc::networking::AsioContextManager> *)0x4a535b);
  return;
}

Assistant:

void TcpComms::queue_rx_function()
{
    while (PortNumber < 0) {
        auto message = rxMessageQueue.pop();
        if (isProtocolCommand(message)) {
            switch (message.messageID) {
                case PORT_DEFINITIONS: {
                    loadPortDefinitions(message);
                }

                break;
                case CLOSE_RECEIVER:
                case DISCONNECT:
                    disconnecting = true;
                    setRxStatus(ConnectionStatus::TERMINATED);
                    return;
            }
        }
    }
    if (PortNumber < 0) {
        setRxStatus(ConnectionStatus::ERRORED);
        return;
    }
    auto ioctx = gmlc::networking::AsioContextManager::getContextPointer();
    auto sf = encrypted ? gmlc::networking::SocketFactory(encryption_config) :
                          gmlc::networking::SocketFactory();
    auto server = gmlc::networking::TcpServer::create(sf,
                                                      ioctx->getBaseContext(),
                                                      localTargetAddress,
                                                      static_cast<uint16_t>(PortNumber.load()),
                                                      reuse_address,
                                                      maxMessageSize);
    while (!server->isReady()) {
        if ((autoPortNumber) && (hasBroker)) {  // If we failed and we are on an automatically
                                                // assigned port number, just try a different port
            server->close();
            ++PortNumber;
            server = gmlc::networking::TcpServer::create(sf,
                                                         ioctx->getBaseContext(),
                                                         localTargetAddress,
                                                         static_cast<uint16_t>(PortNumber),
                                                         reuse_address,
                                                         maxMessageSize);
        } else {
            logWarning("retrying tcp bind");
            std::this_thread::sleep_for(std::chrono::milliseconds(150));
            auto connected = server->reConnect(connectionTimeout);
            if (!connected) {
                logError("unable to bind to tcp connection socket");
                server->close();
                setRxStatus(ConnectionStatus::ERRORED);
                return;
            }
        }
    }
    auto contextLoop = ioctx->startContextLoop();
    server->setDataCall(
        [this](const TcpConnection::pointer& connection, const char* data, size_t datasize) {
            return dataReceive(connection.get(), data, datasize);
        });
    CommsInterface* ci = this;
    server->setErrorCall(
        [ci](const TcpConnection::pointer& connection, const std::error_code& error) {
            return commErrorHandler(ci, connection.get(), error);
        });
    server->start();
    setRxStatus(ConnectionStatus::CONNECTED);
    bool loopRunning = true;
    while (loopRunning) {
        auto message = rxMessageQueue.pop();
        if (isProtocolCommand(message)) {
            switch (message.messageID) {
                case CLOSE_RECEIVER:
                case DISCONNECT:
                    loopRunning = false;
                    break;
            }
        }
    }

    disconnecting = true;
    std::this_thread::sleep_for(std::chrono::milliseconds(50));
    server->close();
    setRxStatus(ConnectionStatus::TERMINATED);
}